

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O2

void amrex::WriteMultiLevelPlotfileHeaders
               (string *plotfilename,int nlevels,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  FabArray<amrex::FArrayBox> *mf_00;
  int level;
  long lVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar5;
  ulong uVar6;
  allocator_type local_2a9;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *local_2a8;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2a0;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *local_298;
  Real local_290;
  Vector<int,_std::allocator<int>_> *local_288;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> boxArrays;
  string HeaderFileName;
  IO_Buffer io_buffer;
  string ed;
  int aiStack_210 [120];
  
  local_2a8 = mf;
  local_2a0 = varnames;
  local_298 = geom;
  local_290 = time;
  local_288 = level_steps;
  PreBuildDirectorHierarchy
            (plotfilename,(string *)CONCAT44(in_register_00000034,nlevels),nlevels,false);
  __rhs = (extra_dirs->
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (extra_dirs->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != pbVar1) {
    for (; __rhs != pbVar1; __rhs = __rhs + 1) {
      std::operator+(&HeaderFileName,plotfilename,"/");
      pbVar4 = &HeaderFileName;
      std::operator+(&ed,&HeaderFileName,__rhs);
      std::__cxx11::string::~string((string *)&HeaderFileName);
      PreBuildDirectorHierarchy(&ed,pbVar4,nlevels,false);
      std::__cxx11::string::~string((string *)&ed);
    }
  }
  ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    std::vector<char,_std::allocator<char>_>::vector
              (&io_buffer.super_vector<char,_std::allocator<char>_>,0x200000,(allocator_type *)&ed);
    std::operator+(&HeaderFileName,plotfilename,"/Header");
    std::ofstream::ofstream(&ed);
    (**(code **)(ed._M_string_length + 0x18))
              (&ed._M_string_length,
               io_buffer.super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,(long)io_buffer.super_vector<char,_std::allocator<char>_>.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)io_buffer.super_vector<char,_std::allocator<char>_>.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
    std::ofstream::open((char *)&ed,(_Ios_Openmode)HeaderFileName._M_dataplus._M_p);
    if (*(int *)((long)aiStack_210 + *(long *)(ed._M_dataplus._M_p + -0x18)) != 0) {
      FileOpenFailed(&HeaderFileName);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              (&boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               (long)nlevels,&local_2a9);
    lVar5 = 0;
    for (lVar2 = 0;
        lVar2 < ((long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68; lVar2 = lVar2 + 1) {
      BoxArray::operator=((BoxArray *)
                          ((long)&((boxArrays.
                                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                          lVar5),(BoxArray *)
                                 ((long)&((local_2a8->
                                          super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                          ).
                                          super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar2]->
                                         super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8));
      lVar5 = lVar5 + 0x68;
    }
    WriteGenericPlotfileHeader
              ((ostream *)&ed,nlevels,&boxArrays,local_2a0,local_298,local_290,local_288,ref_ratio,
               versionName,levelPrefix,mfPrefix);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
              (&boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
    std::ofstream::~ofstream(&ed);
    std::__cxx11::string::~string((string *)&HeaderFileName);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&io_buffer);
  }
  uVar3 = 0;
  uVar6 = (ulong)(uint)nlevels;
  if (nlevels < 1) {
    uVar6 = uVar3;
  }
  for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    mf_00 = &(local_2a8->
             super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
             super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar3]->super_FabArray<amrex::FArrayBox>;
    MultiFabFileFullPrefix(&ed,(int)uVar3,plotfilename,levelPrefix,mfPrefix);
    VisMF::WriteOnlyHeader(mf_00,&ed,NFiles);
    std::__cxx11::string::~string((string *)&ed);
  }
  return;
}

Assistant:

void
WriteMultiLevelPlotfileHeaders (const std::string & plotfilename, int nlevels,
                                const Vector<const MultiFab*> & mf,
                                const Vector<std::string>     & varnames,
                                const Vector<Geometry>        & geom,
                                Real time, const Vector<int>  & level_steps,
                                const Vector<IntVect>     & ref_ratio,
                                const std::string         & versionName,
                                const std::string         & levelPrefix,
                                const std::string         & mfPrefix,
                                const Vector<std::string> & extra_dirs)
{
    BL_PROFILE("WriteMultiLevelPlotfile()");

    int finest_level = nlevels-1;

    bool callBarrier(false);
    PreBuildDirectorHierarchy(plotfilename, levelPrefix, nlevels, callBarrier);
    if (!extra_dirs.empty()) {
        for (const auto& d : extra_dirs) {
            const std::string ed = plotfilename+"/"+d;
            amrex::PreBuildDirectorHierarchy(ed, levelPrefix, nlevels, callBarrier);
        }
    }
    ParallelDescriptor::Barrier();

    if (ParallelDescriptor::IOProcessor()) {
        VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);
        std::string HeaderFileName(plotfilename + "/Header");
        std::ofstream HeaderFile;
        HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
        HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                        std::ofstream::trunc |
                        std::ofstream::binary);
        if( ! HeaderFile.good()) {
            FileOpenFailed(HeaderFileName);
        }

        Vector<BoxArray> boxArrays(nlevels);
        for(int level(0); level < boxArrays.size(); ++level) {
            boxArrays[level] = mf[level]->boxArray();
        }

        WriteGenericPlotfileHeader(HeaderFile, nlevels, boxArrays, varnames,
                                   geom, time, level_steps, ref_ratio, versionName, levelPrefix, mfPrefix);
    }

    for (int level = 0; level <= finest_level; ++level) {
        const MultiFab * data;
        data = mf[level];
        VisMF::WriteOnlyHeader(*data, MultiFabFileFullPrefix(level, plotfilename, levelPrefix, mfPrefix));
    }

}